

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O3

char * MyGame_Example_Any_parse_json_enum
                 (flatcc_json_parser_t *ctx,char *buf,char *end,int *value_sign,uint64_t *value,
                 int *aggregate)

{
  ulong *buf_00;
  ulong *puVar1;
  uint64_t uVar2;
  ulong *buf_01;
  ulong uVar3;
  
  if ((ulong)((long)end - (long)buf) < 8) {
    uVar3 = 0;
    switch((long)end - (long)buf) {
    case 7:
      uVar3 = (long)buf[6] << 8;
    case 6:
      uVar3 = uVar3 | (long)buf[5] << 0x10;
    case 5:
      uVar3 = uVar3 | (long)buf[4] << 0x18;
    case 4:
      uVar3 = uVar3 | (long)buf[3] << 0x20;
    case 3:
      uVar3 = uVar3 | (long)buf[2] << 0x28;
    case 2:
      uVar3 = uVar3 | (long)buf[1] << 0x30;
    case 1:
      uVar3 = (ulong)(byte)*buf << 0x38 | uVar3;
      break;
    default:
      goto switchD_0011173e_default;
    }
  }
  else {
    uVar3 = *(ulong *)buf;
    uVar3 = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
            (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
            (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
  }
  if (uVar3 < 0x4d6f6e7374657200) {
    if ((uVar3 & 0x7fffff0000000000) != 0x416c740000000000) {
      return buf;
    }
    puVar1 = (ulong *)flatcc_json_parser_match_constant(ctx,buf,end,3,aggregate);
    if (puVar1 == (ulong *)buf) {
      return buf;
    }
    uVar2 = 4;
  }
  else if (uVar3 == 0x4d6f6e7374657232) {
    puVar1 = (ulong *)flatcc_json_parser_match_constant(ctx,buf,end,8,aggregate);
    if (puVar1 == (ulong *)buf) {
      return buf;
    }
    uVar2 = 3;
  }
  else {
    buf_01 = (ulong *)buf;
    if ((uVar3 & 0xffffffffffffff00) == 0x4d6f6e7374657200) {
      puVar1 = (ulong *)flatcc_json_parser_match_constant(ctx,buf,end,7,aggregate);
      uVar2 = 1;
      buf_01 = puVar1;
      if (puVar1 != (ulong *)buf) goto LAB_0011163d;
    }
    if ((int)(uVar3 >> 0x20) == 0x4e4f4e45) {
      puVar1 = (ulong *)flatcc_json_parser_match_constant(ctx,(char *)buf_01,end,4,aggregate);
      if (puVar1 == buf_01) {
        return buf;
      }
      uVar2 = 0;
    }
    else {
      if (uVar3 != 0x5465737453696d70) {
        return buf;
      }
      puVar1 = buf_01 + 1;
      if ((ulong)((long)end - (long)puVar1) < 8) {
        uVar3 = 0;
        switch((long)end - (long)puVar1) {
        case 7:
          uVar3 = (long)(char)*(byte *)((long)buf_01 + 0xe) << 8;
        case 6:
          uVar3 = uVar3 | (long)(char)*(byte *)((long)buf_01 + 0xd) << 0x10;
        case 5:
          uVar3 = uVar3 | (long)(char)*(byte *)((long)buf_01 + 0xc) << 0x18;
        case 4:
          uVar3 = uVar3 | (long)(char)*(byte *)((long)buf_01 + 0xb) << 0x20;
        case 3:
          uVar3 = uVar3 | (long)(char)*(byte *)((long)buf_01 + 10) << 0x28;
        case 2:
          uVar3 = uVar3 | (long)(char)*(byte *)((long)buf_01 + 9) << 0x30;
        case 1:
          uVar3 = (ulong)(byte)*puVar1 << 0x38 | uVar3;
          break;
        default:
          return buf;
        }
      }
      else {
        uVar3 = *puVar1;
        uVar3 = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 | (uVar3 & 0xff00) << 0x28 |
                uVar3 << 0x38;
      }
      if (uVar3 != 0x6c655461626c6557) {
        return buf;
      }
      buf_00 = buf_01 + 2;
      if ((ulong)((long)end - (long)buf_00) < 8) {
        uVar3 = 0;
        switch((long)end - (long)buf_00) {
        case 7:
          uVar3 = (long)(char)*(byte *)((long)buf_01 + 0x16) << 8;
        case 6:
          uVar3 = uVar3 | (long)(char)*(byte *)((long)buf_01 + 0x15) << 0x10;
        case 5:
          uVar3 = uVar3 | (long)(char)*(byte *)((long)buf_01 + 0x14) << 0x18;
        case 4:
          uVar3 = uVar3 | (long)(char)*(byte *)((long)buf_01 + 0x13) << 0x20;
        case 3:
          uVar3 = uVar3 | (long)(char)*(byte *)((long)buf_01 + 0x12) << 0x28;
        case 2:
          uVar3 = uVar3 | (long)(char)*(byte *)((long)buf_01 + 0x11) << 0x30;
        case 1:
          uVar3 = (ulong)(byte)*buf_00 << 0x38 | uVar3;
          break;
        default:
          return buf;
        }
      }
      else {
        uVar3 = *buf_00;
        uVar3 = (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
                (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18
                | (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
      }
      if (uVar3 != 0x697468456e756d00) {
        return buf;
      }
      puVar1 = (ulong *)flatcc_json_parser_match_constant(ctx,(char *)buf_00,end,7,aggregate);
      if (puVar1 == buf_00) {
        return buf;
      }
      uVar2 = 2;
    }
  }
LAB_0011163d:
  *value = uVar2;
  *value_sign = 0;
  buf = (char *)puVar1;
switchD_0011173e_default:
  return (char *)(ulong *)buf;
}

Assistant:

static const char *MyGame_Example_Any_parse_json_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,
        int *value_sign, uint64_t *value, int *aggregate)
{
    const char *unmatched = buf;
    const char *mark;
    uint64_t w;

    w = flatcc_json_parser_symbol_part(buf, end);
    if (w < 0x4d6f6e7374657200) { /* branch "Monster" */
        if ((w & 0xffffff0000000000) == 0x416c740000000000) { /* "Alt" */
            buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 3, aggregate);
            if (buf != mark) {
                *value = UINT64_C(4), *value_sign = 0;
            } else {
                return unmatched;
            }
        } else { /* "Alt" */
            return unmatched;
        } /* "Alt" */
    } else { /* branch "Monster" */
        if (w == 0x4d6f6e7374657232) { /* "Monster2" */
            buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 8, aggregate);
            if (buf != mark) {
                *value = UINT64_C(3), *value_sign = 0;
            } else {
                goto pfguard1;
            }
        } else { /* "Monster2" */
            if ((w & 0xffffffffffffff00) == 0x4d6f6e7374657200) { /* "Monster" */
                buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 7, aggregate);
                if (buf != mark) {
                    *value = UINT64_C(1), *value_sign = 0;
                } else {
                    goto pfguard1;
                }
            } else { /* "Monster" */
                goto pfguard1;
            } /* "Monster" */
        } /* "Monster2" */
        goto endpfguard1;
pfguard1:
        if ((w & 0xffffffff00000000) == 0x4e4f4e4500000000) { /* "NONE" */
            buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 4, aggregate);
            if (buf != mark) {
                *value = UINT64_C(0), *value_sign = 0;
            } else {
                goto pfguard2;
            }
        } else { /* "NONE" */
            goto pfguard2;
        } /* "NONE" */
        goto endpfguard2;
pfguard2:
        if (w == 0x5465737453696d70) { /* descend "TestSimp" */
            buf += 8;
            w = flatcc_json_parser_symbol_part(buf, end);
            if (w == 0x6c655461626c6557) { /* descend "leTableW" */
                buf += 8;
                w = flatcc_json_parser_symbol_part(buf, end);
                if ((w & 0xffffffffffffff00) == 0x697468456e756d00) { /* "ithEnum" */
                    buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 7, aggregate);
                    if (buf != mark) {
                        *value = UINT64_C(2), *value_sign = 0;
                    } else {
                        return unmatched;
                    }
                } else { /* "ithEnum" */
                    return unmatched;
                } /* "ithEnum" */
            } else { /* descend "leTableW" */
                return unmatched;
            } /* descend "leTableW" */
        } else { /* descend "TestSimp" */
            return unmatched;
        } /* descend "TestSimp" */
endpfguard2:
        (void)0;
endpfguard1:
        (void)0;
    } /* branch "Monster" */
    return buf;
}